

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_resampler.cc
# Opt level: O3

int __thiscall
webrtc::PushResampler<float>::InitializeIfNeeded
          (PushResampler<float> *this,int src_sample_rate_hz,int dst_sample_rate_hz,
          size_t num_channels)

{
  PushSincResampler *pPVar1;
  float *pfVar2;
  PushSincResampler *pPVar3;
  float *pfVar4;
  ulong uVar5;
  
  if (((this->src_sample_rate_hz_ != src_sample_rate_hz) ||
      (this->dst_sample_rate_hz_ != dst_sample_rate_hz)) || (this->num_channels_ != num_channels)) {
    if (num_channels - 3 < 0xfffffffffffffffe || (dst_sample_rate_hz < 1 || src_sample_rate_hz < 1))
    {
      return -1;
    }
    this->src_sample_rate_hz_ = src_sample_rate_hz;
    this->dst_sample_rate_hz_ = dst_sample_rate_hz;
    this->num_channels_ = num_channels;
    pPVar3 = (PushSincResampler *)operator_new(0x40);
    PushSincResampler::PushSincResampler
              (pPVar3,(ulong)(uint)src_sample_rate_hz / 100,(ulong)(uint)dst_sample_rate_hz / 100);
    pPVar1 = (this->sinc_resampler_)._M_t.
             super___uniq_ptr_impl<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>
             ._M_t.
             super__Tuple_impl<0UL,_webrtc::PushSincResampler_*,_std::default_delete<webrtc::PushSincResampler>_>
             .super__Head_base<0UL,_webrtc::PushSincResampler_*,_false>._M_head_impl;
    (this->sinc_resampler_)._M_t.
    super___uniq_ptr_impl<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>
    ._M_t.
    super__Tuple_impl<0UL,_webrtc::PushSincResampler_*,_std::default_delete<webrtc::PushSincResampler>_>
    .super__Head_base<0UL,_webrtc::PushSincResampler_*,_false>._M_head_impl = pPVar3;
    if (pPVar1 != (PushSincResampler *)0x0) {
      (*(pPVar1->super_SincResamplerCallback)._vptr_SincResamplerCallback[1])();
    }
    if (this->num_channels_ == 2) {
      uVar5 = (ulong)(((uint)src_sample_rate_hz / 100) * 4);
      pfVar4 = (float *)operator_new__(uVar5);
      pfVar2 = (this->src_left_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
               _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      (this->src_left_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar4;
      if (pfVar2 != (float *)0x0) {
        operator_delete__(pfVar2);
      }
      pfVar4 = (float *)operator_new__(uVar5);
      pfVar2 = (this->src_right_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
               _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      (this->src_right_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar4;
      if (pfVar2 != (float *)0x0) {
        operator_delete__(pfVar2);
      }
      uVar5 = (ulong)(((uint)dst_sample_rate_hz / 100) * 4);
      pfVar4 = (float *)operator_new__(uVar5);
      pfVar2 = (this->dst_left_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
               _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      (this->dst_left_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar4;
      if (pfVar2 != (float *)0x0) {
        operator_delete__(pfVar2);
      }
      pfVar4 = (float *)operator_new__(uVar5);
      pfVar2 = (this->dst_right_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
               _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      (this->dst_right_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar4;
      if (pfVar2 != (float *)0x0) {
        operator_delete__(pfVar2);
      }
      pPVar3 = (PushSincResampler *)operator_new(0x40);
      PushSincResampler::PushSincResampler
                (pPVar3,(ulong)(uint)src_sample_rate_hz / 100,(ulong)(uint)dst_sample_rate_hz / 100)
      ;
      pPVar1 = (this->sinc_resampler_right_)._M_t.
               super___uniq_ptr_impl<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>
               ._M_t.
               super__Tuple_impl<0UL,_webrtc::PushSincResampler_*,_std::default_delete<webrtc::PushSincResampler>_>
               .super__Head_base<0UL,_webrtc::PushSincResampler_*,_false>._M_head_impl;
      (this->sinc_resampler_right_)._M_t.
      super___uniq_ptr_impl<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>
      ._M_t.
      super__Tuple_impl<0UL,_webrtc::PushSincResampler_*,_std::default_delete<webrtc::PushSincResampler>_>
      .super__Head_base<0UL,_webrtc::PushSincResampler_*,_false>._M_head_impl = pPVar3;
      if (pPVar1 != (PushSincResampler *)0x0) {
        (*(pPVar1->super_SincResamplerCallback)._vptr_SincResamplerCallback[1])();
      }
    }
  }
  return 0;
}

Assistant:

int PushResampler<T>::InitializeIfNeeded(int src_sample_rate_hz,
                                         int dst_sample_rate_hz,
                                         size_t num_channels) {
  if (src_sample_rate_hz == src_sample_rate_hz_ &&
      dst_sample_rate_hz == dst_sample_rate_hz_ &&
      num_channels == num_channels_)
    // No-op if settings haven't changed.
    return 0;

  if (src_sample_rate_hz <= 0 || dst_sample_rate_hz <= 0 ||
      num_channels <= 0 || num_channels > 2)
    return -1;

  src_sample_rate_hz_ = src_sample_rate_hz;
  dst_sample_rate_hz_ = dst_sample_rate_hz;
  num_channels_ = num_channels;

  const size_t src_size_10ms_mono =
      static_cast<size_t>(src_sample_rate_hz / 100);
  const size_t dst_size_10ms_mono =
      static_cast<size_t>(dst_sample_rate_hz / 100);
  sinc_resampler_.reset(new PushSincResampler(src_size_10ms_mono,
                                              dst_size_10ms_mono));
  if (num_channels_ == 2) {
    src_left_.reset(new T[src_size_10ms_mono]);
    src_right_.reset(new T[src_size_10ms_mono]);
    dst_left_.reset(new T[dst_size_10ms_mono]);
    dst_right_.reset(new T[dst_size_10ms_mono]);
    sinc_resampler_right_.reset(new PushSincResampler(src_size_10ms_mono,
                                                      dst_size_10ms_mono));
  }

  return 0;
}